

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

bool __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
contains<char_const(&)[9]>
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
           *this,char (*item) [9])

{
  enable_if_t<detail::move_if_unreferenced<bool>::value,_bool> eVar1;
  object oStack_38;
  str_attr_accessor local_30;
  
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::attr
            (&local_30,
             (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
              *)this,"__contains__");
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)&oStack_38,(char (*) [9])&local_30);
  eVar1 = cast<bool>(&oStack_38);
  object::~object(&oStack_38);
  object::~object(&local_30.cache);
  return eVar1;
}

Assistant:

bool object_api<D>::contains(T &&item) const {
    return attr("__contains__")(std::forward<T>(item)).template cast<bool>();
}